

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

void __thiscall cppwinrt::writer::write_code(writer *this,string_view *value)

{
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  const_iterator local_38;
  value_type_conflict *c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  string_view *value_local;
  writer *this_local;
  
  __begin2 = (const_iterator)value;
  __range2 = value;
  value_local = (string_view *)this;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin(value);
  c = std::basic_string_view<char,_std::char_traits<char>_>::end
                ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  __buf_00 = extraout_RDX;
  do {
    if (__end2 == c) {
      return;
    }
    local_38 = __end2;
    if (*__end2 == '.') {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"::");
      writer_base<cppwinrt::writer>::write
                (&this->super_writer_base<cppwinrt::writer>,(int)&local_48,__buf,in_RCX);
      __buf_00 = extraout_RDX_00;
    }
    else {
      if (*__end2 == '`') {
        return;
      }
      writer_base<cppwinrt::writer>::write
                (&this->super_writer_base<cppwinrt::writer>,(int)*__end2,__buf_00,in_RCX);
      __buf_00 = extraout_RDX_01;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

void write_code(std::string_view const& value)
        {
            for (auto&& c : value)
            {
                if (c == '.')
                {
                    write("::");
                }
                else if (c == '`')
                {
                    return;
                }
                else
                {
                    write(c);
                }
            }
        }